

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessellationShaderCase::iterate
          (TessellationShaderCase *this)

{
  TestLog *pTVar1;
  Context *pCVar2;
  RenderContext *pRVar3;
  bool bVar4;
  ContextType ctxType;
  int iVar5;
  undefined4 extraout_var;
  ProgramSources *pPVar6;
  ProgramSources *pPVar7;
  TestError *pTVar8;
  NotSupportedError *this_00;
  ScopedLogSection section;
  CallLogWrapper gl;
  string local_330;
  string local_310;
  string local_2f0;
  undefined1 local_2d0 [40];
  string local_2a8;
  undefined1 local_288 [40];
  undefined1 local_260 [40];
  undefined1 local_238 [40];
  ResultCollector result;
  ShaderProgram program;
  ProgramSources local_f0;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar4) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_tessellation_shader");
    if (!bVar4) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,
                 "Tessellation shader tests require GL_EXT_tessellation_shader extension or an OpenGL ES 3.2 or higher context."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                 ,0xde);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program," // ERROR: ",(allocator<char> *)&local_f0);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,(string *)&program);
  std::__cxx11::string::~string((string *)&program);
  gl.m_enableLog = true;
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,"Query State",(allocator<char> *)local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"3 vertices, triangles, equal_spacing, cw",
             (allocator<char> *)local_2d0);
  pPVar7 = &local_f0;
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&program,(string *)pPVar7);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&program);
  pCVar2 = (this->super_TestCase).m_context;
  pRVar3 = pCVar2->m_renderCtx;
  memset(&local_f0,0,0xac);
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f0._193_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2a8,(_anonymous_namespace_ *)pCVar2,
             (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)pPVar7);
  glu::VertexSource::VertexSource((VertexSource *)local_288,&local_2a8);
  pPVar6 = glu::ProgramSources::operator<<(&local_f0,(ShaderSource *)local_288);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2f0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)pPVar7);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_2d0,&local_2f0);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_2d0);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_310,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices = 3) out;\nvoid main()\n{\n}\n"
             ,(char *)pPVar7);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_238,&local_310);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_238);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_330,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(triangles, equal_spacing, cw) in;\nvoid main()\n{\n}\n"
             ,(char *)pPVar7);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_260,&local_330);
  pPVar7 = glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_260);
  glu::ShaderProgram::ShaderProgram(&program,pRVar3,pPVar7);
  std::__cxx11::string::~string((string *)(local_260 + 8));
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)(local_238 + 8));
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)(local_2d0 + 8));
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)(local_288 + 8));
  std::__cxx11::string::~string((string *)&local_2a8);
  glu::ProgramSources::~ProgramSources(&local_f0);
  if (program.m_program.m_info.linkOk == false) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Compile failed","program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
               ,0x116);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            (&result,&gl,program.m_program.m_program,0x8e75,3,this->m_verifier);
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            (&result,&gl,program.m_program.m_program,0x8e76,4,this->m_verifier);
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            (&result,&gl,program.m_program.m_program,0x8e77,0x202,this->m_verifier);
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            (&result,&gl,program.m_program.m_program,0x8e78,0x900,this->m_verifier);
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            (&result,&gl,program.m_program.m_program,0x8e79,0,this->m_verifier);
  glu::ShaderProgram::~ShaderProgram(&program);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,"Query State",(allocator<char> *)local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"5 vertices, quads, fractional_even_spacing, ccw",
             (allocator<char> *)local_2d0);
  pPVar7 = &local_f0;
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&program,(string *)pPVar7);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&program);
  pCVar2 = (this->super_TestCase).m_context;
  pRVar3 = pCVar2->m_renderCtx;
  memset(&local_f0,0,0xac);
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f0._193_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2a8,(_anonymous_namespace_ *)pCVar2,
             (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)pPVar7);
  glu::VertexSource::VertexSource((VertexSource *)local_288,&local_2a8);
  pPVar6 = glu::ProgramSources::operator<<(&local_f0,(ShaderSource *)local_288);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2f0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)pPVar7);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_2d0,&local_2f0);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_2d0);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_310,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices = 5) out;\nvoid main()\n{\n}\n"
             ,(char *)pPVar7);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_238,&local_310);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_238);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_330,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(quads, fractional_even_spacing, ccw) in;\nvoid main()\n{\n}\n"
             ,(char *)pPVar7);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_260,&local_330);
  pPVar7 = glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_260);
  glu::ShaderProgram::ShaderProgram(&program,pRVar3,pPVar7);
  std::__cxx11::string::~string((string *)(local_260 + 8));
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)(local_238 + 8));
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)(local_2d0 + 8));
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)(local_288 + 8));
  std::__cxx11::string::~string((string *)&local_2a8);
  glu::ProgramSources::~ProgramSources(&local_f0);
  if (program.m_program.m_info.linkOk == false) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Compile failed","program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
               ,0x129);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            (&result,&gl,program.m_program.m_program,0x8e75,5,this->m_verifier);
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            (&result,&gl,program.m_program.m_program,0x8e76,7,this->m_verifier);
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            (&result,&gl,program.m_program.m_program,0x8e77,0x8e7c,this->m_verifier);
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            (&result,&gl,program.m_program.m_program,0x8e78,0x901,this->m_verifier);
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            (&result,&gl,program.m_program.m_program,0x8e79,0,this->m_verifier);
  glu::ShaderProgram::~ShaderProgram(&program);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,"Query State",(allocator<char> *)local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"5 vertices, isolines, fractional_odd_spacing, ccw, point_mode",
             (allocator<char> *)local_2d0);
  pPVar7 = &local_f0;
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&program,(string *)pPVar7);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&program);
  pCVar2 = (this->super_TestCase).m_context;
  pRVar3 = pCVar2->m_renderCtx;
  memset(&local_f0,0,0xac);
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f0._193_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2a8,(_anonymous_namespace_ *)pCVar2,
             (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)pPVar7);
  glu::VertexSource::VertexSource((VertexSource *)local_288,&local_2a8);
  pPVar6 = glu::ProgramSources::operator<<(&local_f0,(ShaderSource *)local_288);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2f0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)pPVar7);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_2d0,&local_2f0);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_2d0);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_310,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices = 5) out;\nvoid main()\n{\n}\n"
             ,(char *)pPVar7);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_238,&local_310);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_238);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_330,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(isolines, fractional_odd_spacing, ccw, point_mode) in;\nvoid main()\n{\n}\n"
             ,(char *)pPVar7);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_260,&local_330);
  pPVar7 = glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_260);
  glu::ShaderProgram::ShaderProgram(&program,pRVar3,pPVar7);
  std::__cxx11::string::~string((string *)(local_260 + 8));
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)(local_238 + 8));
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)(local_2d0 + 8));
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)(local_288 + 8));
  std::__cxx11::string::~string((string *)&local_2a8);
  glu::ProgramSources::~ProgramSources(&local_f0);
  if (program.m_program.m_info.linkOk != false) {
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program
                   );
    deqp::gls::StateQueryUtil::verifyStateProgramInteger
              (&result,&gl,program.m_program.m_program,0x8e75,5,this->m_verifier);
    deqp::gls::StateQueryUtil::verifyStateProgramInteger
              (&result,&gl,program.m_program.m_program,0x8e76,0x8e7a,this->m_verifier);
    deqp::gls::StateQueryUtil::verifyStateProgramInteger
              (&result,&gl,program.m_program.m_program,0x8e77,0x8e7b,this->m_verifier);
    deqp::gls::StateQueryUtil::verifyStateProgramInteger
              (&result,&gl,program.m_program.m_program,0x8e78,0x901,this->m_verifier);
    deqp::gls::StateQueryUtil::verifyStateProgramInteger
              (&result,&gl,program.m_program.m_program,0x8e79,1,this->m_verifier);
    glu::ShaderProgram::~ShaderProgram(&program);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    tcu::ResultCollector::setTestContextResult
              (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::ResultCollector::~ResultCollector(&result);
    glu::CallLogWrapper::~CallLogWrapper(&gl);
    return STOP;
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,"Compile failed","program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
             ,0x13c);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TessellationShaderCase::IterateResult TessellationShaderCase::iterate (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		TCU_THROW(NotSupportedError, "Tessellation shader tests require GL_EXT_tessellation_shader extension or an OpenGL ES 3.2 or higher context.");


	static const char* const	s_vtxFragTemplate	=	"${GLSL_VERSION_DECL}\n"
														"void main()\n"
														"{\n"
														"}\n";

	static const char* const	s_tessCtrlTemplate1	=	"${GLSL_VERSION_DECL}\n"
														"${TESSELLATION_SHADER_REQUIRE}\n"
														"layout(vertices = 3) out;\n"
														"void main()\n"
														"{\n"
														"}\n";

	static const char* const	s_tessEvalTemplate1	=	"${GLSL_VERSION_DECL}\n"
														"${TESSELLATION_SHADER_REQUIRE}\n"
														"layout(triangles, equal_spacing, cw) in;\n"
														"void main()\n"
														"{\n"
														"}\n";

	static const char* const	s_tessCtrlTemplate2	=	"${GLSL_VERSION_DECL}\n"
														"${TESSELLATION_SHADER_REQUIRE}\n"
														"layout(vertices = 5) out;\n"
														"void main()\n"
														"{\n"
														"}\n";

	static const char* const	s_tessEvalTemplate2	=	"${GLSL_VERSION_DECL}\n"
														"${TESSELLATION_SHADER_REQUIRE}\n"
														"layout(quads, fractional_even_spacing, ccw) in;\n"
														"void main()\n"
														"{\n"
														"}\n";

	static const char* const	s_tessEvalTemplate3	=	"${GLSL_VERSION_DECL}\n"
														"${TESSELLATION_SHADER_REQUIRE}\n"
														"layout(isolines, fractional_odd_spacing, ccw, point_mode) in;\n"
														"void main()\n"
														"{\n"
														"}\n";

	glu::CallLogWrapper			gl						(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector		result					(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Query State", "3 vertices, triangles, equal_spacing, cw");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::FragmentSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::TessellationControlSource(specializeShader(m_context, s_tessCtrlTemplate1))
			<< glu::TessellationEvaluationSource(specializeShader(m_context, s_tessEvalTemplate1)));

		TCU_CHECK_MSG(program.isOk(), "Compile failed");

		m_testCtx.getLog() << program;

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_CONTROL_OUTPUT_VERTICES, 3, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_MODE, GL_TRIANGLES, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_SPACING, GL_EQUAL, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_VERTEX_ORDER, GL_CW, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_POINT_MODE, GL_FALSE, m_verifier);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Query State", "5 vertices, quads, fractional_even_spacing, ccw");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::FragmentSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::TessellationControlSource(specializeShader(m_context, s_tessCtrlTemplate2))
			<< glu::TessellationEvaluationSource(specializeShader(m_context, s_tessEvalTemplate2)));

		TCU_CHECK_MSG(program.isOk(), "Compile failed");

		m_testCtx.getLog() << program;

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_CONTROL_OUTPUT_VERTICES, 5, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_MODE, GL_QUADS, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_SPACING, GL_FRACTIONAL_EVEN, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_VERTEX_ORDER, GL_CCW, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_POINT_MODE, GL_FALSE, m_verifier);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Query State", "5 vertices, isolines, fractional_odd_spacing, ccw, point_mode");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::FragmentSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::TessellationControlSource(specializeShader(m_context, s_tessCtrlTemplate2))
			<< glu::TessellationEvaluationSource(specializeShader(m_context, s_tessEvalTemplate3)));

		TCU_CHECK_MSG(program.isOk(), "Compile failed");

		m_testCtx.getLog() << program;

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_CONTROL_OUTPUT_VERTICES, 5, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_MODE, GL_ISOLINES, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_SPACING, GL_FRACTIONAL_ODD, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_VERTEX_ORDER, GL_CCW, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_POINT_MODE, GL_TRUE, m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}